

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

void Js::JavascriptArray::MergeSort<unsigned_int>
               (uint *list,uint32 length,CompareVarsInfo *cvInfo,ArenaAllocator *allocator)

{
  _func_bool_CompareVarsInfo_ptr_void_ptr_void_ptr *p_Var1;
  code *pcVar2;
  int iVar3;
  uint uVar4;
  bool bVar5;
  BOOL BVar6;
  uint uVar7;
  undefined4 *puVar8;
  char *pcVar9;
  uint *puVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  uint *puVar16;
  uint uVar17;
  long lVar18;
  ulong local_78;
  uint local_44;
  uint *local_40;
  uint local_34 [2];
  uint rightElement;
  
  p_Var1 = cvInfo->compareType;
  local_40 = list;
  if (length == 0) {
    pcVar9 = &DAT_00000008;
  }
  else {
    BVar6 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar6 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar5) goto LAB_00bb1769;
      *puVar8 = 0;
    }
    pcVar9 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             AllocInternal(&allocator->
                            super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                           ,(ulong)length << 2);
    if (pcVar9 == (char *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar5) {
LAB_00bb1769:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar8 = 0;
    }
  }
  if (2 < length * 2) {
    puVar16 = local_40;
    uVar4 = 2;
    uVar13 = 1;
    do {
      uVar7 = uVar4;
      if (length != 0) {
        uVar12 = 0;
        uVar4 = uVar13;
        do {
          uVar17 = uVar12 + uVar13;
          if (uVar17 < length) {
            local_78 = (ulong)(uVar17 - 1);
            puVar10 = puVar16 + local_78;
            bVar5 = (*p_Var1)(cvInfo,puVar16 + uVar17,puVar10);
            if (bVar5) {
              uVar11 = uVar12 + uVar7;
              if (length <= uVar12 + uVar7) {
                uVar11 = length;
              }
              uVar14 = 0xffffffff;
              if (uVar17 < uVar11) {
                lVar15 = 0;
                do {
                  *(uint *)(pcVar9 + lVar15 * 4) = local_40[(ulong)uVar4 + lVar15];
                  lVar18 = (ulong)uVar4 + lVar15;
                  lVar15 = lVar15 + 1;
                } while (lVar18 + 1U < (ulong)uVar11);
                uVar17 = uVar4 + (int)lVar15;
                uVar14 = (int)lVar15 - 1;
              }
              local_34[0] = *(uint *)(pcVar9 + (ulong)uVar14 * 4);
              while( true ) {
                local_44 = *puVar10;
                lVar15 = 0;
                while( true ) {
                  lVar18 = (ulong)uVar14 + lVar15;
                  bVar5 = (*p_Var1)(cvInfo,local_34,&local_44);
                  iVar3 = (int)lVar15;
                  uVar11 = (uVar17 - 1) + iVar3;
                  if (bVar5) break;
                  local_40[uVar11] = local_34[0];
                  if ((int)lVar18 == 0) {
                    uVar17 = (uVar17 + iVar3) - 1;
                    goto LAB_00bb16f1;
                  }
                  local_34[0] = *(uint *)(pcVar9 + (ulong)(iVar3 + (uVar14 - 1)) * 4);
                  lVar15 = lVar15 + -1;
                }
                local_40[uVar11] = local_44;
                if ((uint)local_78 <= uVar12) break;
                uVar14 = uVar14 + iVar3;
                uVar17 = (uVar17 - 1) + iVar3;
                local_78 = (ulong)((uint)local_78 - 1);
                puVar10 = local_40 + local_78;
              }
              uVar17 = (uVar17 + iVar3) - 2;
              local_40[uVar17] = local_34[0];
LAB_00bb16f1:
              puVar16 = local_40;
              if (uVar14 + iVar3 != 0) {
                do {
                  uVar17 = uVar17 - 1;
                  local_40[uVar17] = *(uint *)(pcVar9 + lVar18 * 4 + -4);
                  lVar18 = lVar18 + -1;
                } while (lVar18 != 0);
              }
            }
          }
          uVar12 = uVar12 + uVar7;
          uVar4 = uVar4 + uVar7;
        } while (uVar12 < length);
      }
      uVar4 = uVar7 * 2;
      uVar13 = uVar7;
    } while (uVar7 * 2 < length * 2);
  }
  return;
}

Assistant:

void JavascriptArray::MergeSort(T* list, uint32 length, JavascriptArray::CompareVarsInfo* cvInfo, ArenaAllocator* allocator)
    {
        bool (*compareType)(JavascriptArray::CompareVarsInfo*, const void*, const void*) = cvInfo->compareType;
        T* buffer = AnewArray(allocator, T, length);
        uint32 bucketSize = 2, lastSize = 1, position = 0, left = 0, mid = 0, right = 0, i = 0, j = 0, k = 0;
        uint32 doubleLength = length + length;
        T rightElement, leftElement;

        while (bucketSize < doubleLength)
        {
            while (position < length)
            {
                left = position;
                mid = left + lastSize;

                // perform a merge but only if it's necessary
                if (mid < length && compareType (cvInfo, &list[mid], &list[mid - 1]))
                {
                    right = position + bucketSize;
                    right = right < length ? right : length;
                    i = mid - 1, j = 0, k = mid;

                    while (k < right)
                    {
                        buffer[j++] = list[k++];
                    }
    
                    rightElement = buffer[--j];
                    leftElement = list[i];

                    for (;;)
                    {
                        if (compareType (cvInfo, &rightElement, &leftElement))
                        {
                            list[--k] = leftElement;
                            if (i > left)
                            {
                                leftElement = list[--i];
                            }
                            else
                            {
                                list[--k] = rightElement;
                                break;
                            }
                        }
                        else
                        {
                            list[--k] = rightElement;
                            if (j > 0)
                            {
                                rightElement = buffer[--j];
                            }
                            else
                            {
                                break;
                            }
                        }
                    }

                    while (j > 0)
                    {
                        list[--k] = buffer[--j];
                    }
                }  
                position += bucketSize;
            }
            position = 0;
            lastSize = bucketSize;
            bucketSize *= 2;
        }
    }